

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O1

shared_ptr<ITest> __thiscall
injection::injection_private::InjectionEngine<ITest>::config
          (InjectionEngine<ITest> *this,function<ITest_*()> *creationFunction,InjectionCommand cmd,
          InjectionScope scope)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ITest *pIVar2;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  bool bVar4;
  shared_ptr<ITest> sVar5;
  shared_ptr<ITest> instance;
  __shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000014,cmd);
  if (config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
      ::maker == '\0') {
    config();
    _Var3._M_pi = extraout_RDX_04;
  }
  if (config(std::function<ITest*()>,injection::injection_private::InjectionCommand,injection::InjectionScope)
      ::shared == '\0') {
    config();
    _Var3._M_pi = extraout_RDX_05;
  }
  if (cmd == GET) {
    if (config::scopeType == TRANSIENT) {
      local_38._M_ptr = (element_type *)0x0;
      local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (config::maker.super__Function_base._M_manager != (_Manager_type)0x0) {
        pIVar2 = (*config::maker._M_invoker)((_Any_data *)&config::maker);
        std::__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>::reset<ITest>(&local_38,pIVar2);
        _Var3._M_pi = extraout_RDX_02;
      }
      *(element_type **)this = local_38._M_ptr;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_38._M_refcount._M_pi;
      if (local_38._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_38._M_refcount._M_pi)->_M_use_count =
               (local_38._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_38._M_refcount._M_pi)->_M_use_count =
               (local_38._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (local_38._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_03;
      }
      goto LAB_0010b67b;
    }
    if (config::scopeType != SINGLETON) {
      if (config::scopeType != SINGLETON_EAGER) {
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        goto LAB_0010b67b;
      }
      goto LAB_0010b5d3;
    }
    if (config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_0010b570;
  }
  else {
    if (cmd == SET) {
      config::scopeType = scope;
      std::function<ITest_*()>::operator=(&config::maker,creationFunction);
      _Var3._M_pi = extraout_RDX;
      if (scope == SINGLETON_EAGER) {
LAB_0010b570:
        if (config::maker.super__Function_base._M_manager != (_Manager_type)0x0) {
          pIVar2 = (*config::maker._M_invoker)((_Any_data *)&config::maker);
          std::__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>::reset<ITest>
                    (&config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>,pIVar2);
          _Var3._M_pi = extraout_RDX_00;
        }
      }
      else {
        _Var1._M_pi = config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        bVar4 = config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
        if (bVar4) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
          _Var3._M_pi = extraout_RDX_01;
        }
      }
    }
LAB_0010b5d3:
  }
  *(element_type **)this =
       config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1._M_pi = config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
       config::shared.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
LAB_0010b67b:
  sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ITest>)sVar5.super___shared_ptr<ITest,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<I> config(std::function<I*(void)> creationFunction, InjectionCommand cmd, InjectionScope scope = InjectionScope::INVALID) {

        static std::function<I*(void)> maker;
        static InjectionScope scopeType = InjectionScope::INVALID;
        static std::shared_ptr<I> shared;

        switch(cmd) {
            case InjectionCommand::SET:
                scopeType = scope;
                maker = creationFunction;
                if (scope == InjectionScope::SINGLETON_EAGER) {
                    set(shared, maker);
                } else {
                    shared.reset();
                }

                break;
            case InjectionCommand::GET:
                switch(scopeType) {
                    case InjectionScope::SINGLETON_EAGER:
                        return shared;
                    case InjectionScope::SINGLETON:
                        if (shared) {
                            return shared;
                        }
                    return set(shared, maker);

                case InjectionScope::TRANSIENT: {
                        std::shared_ptr<I> instance;
                        return set(instance, maker);
                    }
                default:
                        return std::shared_ptr<I>();
                }

        }
        return shared;
    }